

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

QualifiedName * __thiscall
(anonymous_namespace)::Db::
make<(anonymous_namespace)::QualifiedName,(anonymous_namespace)::Node*&,(anonymous_namespace)::Node*&>
          (Db *this,Node **args,Node **args_1)

{
  QualifiedName *this_00;
  Node **args_local_1;
  Node **args_local;
  Db *this_local;
  
  this_00 = (QualifiedName *)
            anon_unknown.dwarf_426d84::BumpPointerAllocator::allocate
                      ((BumpPointerAllocator *)(this + 0x2f0),0x20);
  anon_unknown.dwarf_426d84::QualifiedName::QualifiedName(this_00,*args,*args_1);
  return this_00;
}

Assistant:

T *make(Args &&... args) {
    return new (ASTAllocator.allocate(sizeof(T)))
        T(std::forward<Args>(args)...);
  }